

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CropResizeLayerParams::SharedDtor(CropResizeLayerParams *this)

{
  CropResizeLayerParams *pCVar1;
  CropResizeLayerParams *this_local;
  
  pCVar1 = internal_default_instance();
  if ((this != pCVar1) && (this->mode_ != (SamplingMode *)0x0)) {
    (*(this->mode_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pCVar1 = internal_default_instance();
  if ((this != pCVar1) && (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0)) {
    (*(this->boxindicesmode_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void CropResizeLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete mode_;
  }
  if (this != internal_default_instance()) {
    delete boxindicesmode_;
  }
}